

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O2

Hash __thiscall
Fossilize::ApplicationInfoFilter::Impl::get_bucket_hash
          (Impl *this,VkPhysicalDeviceProperties2 *props,VkApplicationInfo *info,void *device_pnext)

{
  VariantDependency *pVVar1;
  bool bVar2;
  iterator iVar3;
  VariantDependency *dep;
  VariantDependency *pVVar4;
  VariantDependency *dep_2;
  allocator local_69;
  Hasher local_68;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
  local_58;
  key_type local_50;
  
  local_68.h = 0xaf63bd4c8601b7df;
  if (info == (VkApplicationInfo *)0x0) {
    local_68.h = 0x8328807b4eb6fed;
  }
  else {
    bVar2 = true;
    if (info->pApplicationName != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_50,info->pApplicationName,&local_69);
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->application_infos)._M_h,&local_50);
      bVar2 = true;
      std::__cxx11::string::_M_dispose();
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
          ._M_cur != (__node_type *)0x0) {
        pVVar1 = *(VariantDependency **)
                  ((long)iVar3.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                         ._M_cur + 0x58);
        local_60._M_cur = (__node_type *)this;
        local_58 = iVar3.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                   ._M_cur;
        for (pVVar4 = *(VariantDependency **)
                       ((long)iVar3.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                              ._M_cur + 0x50); pVVar4 != pVVar1; pVVar4 = pVVar4 + 1) {
          hash_variant(&local_68,*pVVar4,props,info,device_pnext,false);
        }
        pVVar1 = *(VariantDependency **)
                  ((long)&((local_58._M_cur)->
                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>
                          ._M_storage._M_storage + 0x68);
        for (pVVar4 = *(VariantDependency **)
                       ((long)&((local_58._M_cur)->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>
                               ._M_storage._M_storage + 0x60); pVVar4 != pVVar1; pVVar4 = pVVar4 + 1
            ) {
          hash_variant(&local_68,*pVVar4,props,info,device_pnext,true);
        }
        bVar2 = false;
        this = (Impl *)local_60;
      }
    }
    local_68.h = local_68.h * 0x100000001b3;
    if (info->pEngineName != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_50,info->pEngineName,&local_69);
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->engine_infos)._M_h,&local_50);
      std::__cxx11::string::_M_dispose();
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
          ._M_cur != (__node_type *)0x0) {
        pVVar1 = *(VariantDependency **)
                  ((long)iVar3.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                         ._M_cur + 0x58);
        local_60 = iVar3.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                   ._M_cur;
        for (pVVar4 = *(VariantDependency **)
                       ((long)iVar3.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                              ._M_cur + 0x50); pVVar4 != pVVar1; pVVar4 = pVVar4 + 1) {
          hash_variant(&local_68,*pVVar4,props,info,device_pnext,false);
        }
        pVVar1 = *(VariantDependency **)
                  ((long)&((local_60._M_cur)->
                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>
                          ._M_storage._M_storage + 0x68);
        for (pVVar4 = *(VariantDependency **)
                       ((long)&((local_60._M_cur)->
                               super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Fossilize::AppInfo>_>
                               ._M_storage._M_storage + 0x60); pVVar4 != pVVar1; pVVar4 = pVVar4 + 1
            ) {
          hash_variant(&local_68,*pVVar4,props,info,device_pnext,true);
        }
        return local_68.h;
      }
    }
    if (!bVar2) {
      return local_68.h;
    }
  }
  pVVar1 = (this->default_variant_dependencies).
           super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_cur = (__node_type *)this;
  for (pVVar4 = (this->default_variant_dependencies).
                super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                ._M_impl.super__Vector_impl_data._M_start; pVVar4 != pVVar1; pVVar4 = pVVar4 + 1) {
    hash_variant(&local_68,*pVVar4,props,info,device_pnext,false);
  }
  pVVar1 = (((vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_> *)
            ((long)local_60._M_cur + 0xf8))->
           super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pVVar4 = (((vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                   *)((long)local_60._M_cur + 0xf8))->
                super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
                )._M_impl.super__Vector_impl_data._M_start; pVVar4 != pVVar1; pVVar4 = pVVar4 + 1) {
    hash_variant(&local_68,*pVVar4,props,info,device_pnext,true);
  }
  return local_68.h;
}

Assistant:

Hash ApplicationInfoFilter::Impl::get_bucket_hash(const VkPhysicalDeviceProperties2 *props,
                                                  const VkApplicationInfo *info,
                                                  const void *device_pnext)
{
	Hasher h;
	bool use_default_variant = true;

	h.u32(0);
	if (info && info->pApplicationName)
	{
		auto itr = application_infos.find(info->pApplicationName);
		if (itr != application_infos.end())
		{
			use_default_variant = false;
			for (auto &dep : itr->second.variant_dependencies)
				hash_variant(h, dep, props, info, device_pnext, false);
			for (auto &dep : itr->second.variant_dependencies_feature)
				hash_variant(h, dep, props, info, device_pnext, true);
		}
	}

	h.u32(0);
	if (info && info->pEngineName)
	{
		auto itr = engine_infos.find(info->pEngineName);
		if (itr != engine_infos.end())
		{
			use_default_variant = false;
			for (auto &dep : itr->second.variant_dependencies)
				hash_variant(h, dep, props, info, device_pnext, false);
			for (auto &dep : itr->second.variant_dependencies_feature)
				hash_variant(h, dep, props, info, device_pnext, true);
		}
	}

	if (use_default_variant)
	{
		for (auto &dep : default_variant_dependencies)
			hash_variant(h, dep, props, info, device_pnext, false);
		for (auto &dep : default_variant_dependencies_feature)
			hash_variant(h, dep, props, info, device_pnext, true);
	}

	return h.get();
}